

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O2

Point2<float> * __thiscall
pbrt::BufferCache<pbrt::Point2<float>_>::LookupOrAdd
          (BufferCache<pbrt::Point2<float>_> *this,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *buf)

{
  iterator iVar1;
  Point2<float> *__dest;
  pointer __src;
  size_t __n;
  pointer pPVar2;
  long in_FS_OFFSET;
  Buffer lookupBuffer;
  value_type local_48;
  key_type local_38;
  
  *(long *)(in_FS_OFFSET + -0x428) = *(long *)(in_FS_OFFSET + -0x428) + 1;
  std::mutex::lock(&this->mutex);
  local_38.ptr = (buf->
                 super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_38.size =
       (long)(buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish - (long)local_38.ptr >> 3;
  iVar1 = std::
          _Hashtable<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_std::allocator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_std::__detail::_Identity,_std::equal_to<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_pbrt::BufferCache<pbrt::Point2<float>_>::BufferHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->cache)._M_h,&local_38);
  if (iVar1.super__Node_iterator_base<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_true>._M_cur
      == (__node_type *)0x0) {
    __dest = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::Point2<float>>
                       (&this->alloc,
                        (long)(buf->
                              super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(buf->
                              super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3);
    __src = (buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
    __n = (long)(buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)__src;
    pPVar2 = __src;
    if (__n != 0) {
      memmove(__dest,__src,__n);
      __src = (buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
      pPVar2 = (buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
    }
    this->bytesUsed = this->bytesUsed + ((long)__src - (long)pPVar2);
    local_48.size = (long)__src - (long)pPVar2 >> 3;
    local_48.ptr = __dest;
    std::__detail::
    _Insert<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_std::allocator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_std::__detail::_Identity,_std::equal_to<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_pbrt::BufferCache<pbrt::Point2<float>_>::BufferHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_std::allocator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_std::__detail::_Identity,_std::equal_to<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_pbrt::BufferCache<pbrt::Point2<float>_>::BufferHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&this->cache,&local_48);
  }
  else {
    *(long *)(in_FS_OFFSET + -0x430) = *(long *)(in_FS_OFFSET + -0x430) + 1;
    *(long *)(in_FS_OFFSET + -0x438) =
         (long)(buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_end_of_storage +
         (*(long *)(in_FS_OFFSET + -0x438) -
         (long)(buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start);
    __dest = *(Point2<float> **)
              ((long)iVar1.
                     super__Node_iterator_base<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_true>
                     ._M_cur + 8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return __dest;
}

Assistant:

const T *LookupOrAdd(const std::vector<T> &buf) {
        ++nBufferCacheLookups;
        std::lock_guard<std::mutex> lock(mutex);
        // Return pointer to data if _buf_ contents is already in the cache
        Buffer lookupBuffer(buf.data(), buf.size());
        if (auto iter = cache.find(lookupBuffer); iter != cache.end()) {
            DCHECK(std::memcmp(buf.data(), iter->ptr, buf.size() * sizeof(T)) == 0);
            ++nBufferCacheHits;
            redundantBufferBytes += buf.capacity() * sizeof(T);
            return iter->ptr;
        }

        // Add _buf_ contents to cache and return pointer to cached copy
        T *ptr = alloc.allocate_object<T>(buf.size());
        std::copy(buf.begin(), buf.end(), ptr);
        bytesUsed += buf.size() * sizeof(T);
        cache.insert(Buffer(ptr, buf.size()));
        return ptr;
    }